

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O3

int henson_queue_empty(char *name)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  NameMap *pNVar3;
  const_iterator cVar4;
  uint uVar5;
  allocator local_39;
  key_type local_38;
  
  pNVar3 = namemap;
  if (namemap == (NameMap *)0x0) {
    uVar5 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_38,name,&local_39);
    cVar4 = std::_Rb_tree<$18d9244a$>::find((_Rb_tree<_18d9244a_> *)&pNVar3->queues_,&local_38);
    p_Var1 = cVar4._M_node[3]._M_left;
    p_Var2 = cVar4._M_node[2]._M_left;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    uVar5 = (uint)(p_Var1 == p_Var2);
  }
  return uVar5;
}

Assistant:

int
henson_queue_empty(const char* name)
{
    if (!namemap) return 1;
    return namemap->queue_empty(name);
}